

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

sexp_conflict
sexp_string_hash(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict str,
                sexp_conflict bound)

{
  undefined1 auVar1 [16];
  sexp_uint_t sVar2;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ulong in_R8;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 9)) {
    if ((in_R8 & 1) == 1) {
      auVar1._8_8_ = (long)in_R8 >> 0x3f;
      auVar1._0_8_ = in_R8 & 0xfffffffffffffffe;
      sVar2 = string_hash((char *)(*(long *)(in_RCX + 2) + 0x10 + *(long *)(in_RCX + 4)),
                          SUB168(auVar1 / SEXT816(2),0));
      local_8 = (sexp_conflict)(sVar2 << 1 | 1);
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,9,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_string_hash (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp bound) {
  if (! sexp_stringp(str))
    return sexp_type_exception(ctx, self, SEXP_STRING, str);
  else if (! sexp_fixnump(bound))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, bound);
  return sexp_make_fixnum(string_hash(sexp_string_data(str),
                                      sexp_unbox_fixnum(bound)));
}